

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::inf_or_nan_writer::operator()
          (inf_or_nan_writer *this,
          truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  inf_or_nan_writer iVar1;
  ulong uVar2;
  char cVar3;
  inf_or_nan_writer *piVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  size_t sVar9;
  inf_or_nan_writer local_8 [8];
  
  iVar1 = *this;
  if (iVar1 != (inf_or_nan_writer)0x0) {
    piVar4 = (inf_or_nan_writer *)(it->super_truncating_iterator_base<char_*>).out_;
    uVar2 = (it->super_truncating_iterator_base<char_*>).count_;
    (it->super_truncating_iterator_base<char_*>).count_ = uVar2 + 1;
    if (uVar2 < (it->super_truncating_iterator_base<char_*>).limit_) {
      (it->super_truncating_iterator_base<char_*>).out_ = (char *)(piVar4 + 1);
    }
    else {
      piVar4 = local_8;
    }
    *piVar4 = iVar1;
  }
  pcVar6 = *(char **)(this + 8);
  pcVar5 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar9 = (it->super_truncating_iterator_base<char_*>).count_;
  cVar7 = it->blackhole_;
  uVar8 = 4;
  do {
    cVar3 = *pcVar6;
    if (sVar9 < uVar2) {
      *pcVar5 = *pcVar6;
      cVar3 = cVar7;
    }
    cVar7 = cVar3;
    pcVar6 = pcVar6 + 1;
    pcVar5 = pcVar5 + (sVar9 < uVar2);
    sVar9 = sVar9 + 1;
    uVar8 = uVar8 - 1;
  } while (1 < uVar8);
  (it->super_truncating_iterator_base<char_*>).out_ = pcVar5;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar9;
  it->blackhole_ = cVar7;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }